

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Literal * __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::truncateForPacking
          (Literal *__return_storage_ptr__,
          ExpressionRunner<wasm::PrecomputingExpressionRunner> *this,Literal *value,Field *field)

{
  anon_union_16_5_9943fe1e_for_Literal_0 local_30;
  undefined8 local_20;
  
  if ((field->type).id == 2) {
    if ((value->type).id != 2) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                    ,0x118,"int32_t wasm::Literal::geti32() const");
    }
    if (field->packedType == i16) {
      local_30.i32 = (int32_t)*(ushort *)&value->field_0;
      local_20 = 2;
      Literal::operator=(value,(Literal *)&local_30.func);
    }
    else {
      if (field->packedType != i8) goto LAB_0083a2e1;
      local_30.i32 = (int32_t)(byte)*(ushort *)&value->field_0;
      local_20 = 2;
      Literal::operator=(value,(Literal *)&local_30.func);
    }
    Literal::~Literal((Literal *)&local_30.func);
  }
LAB_0083a2e1:
  Literal::Literal(__return_storage_ptr__,value);
  return __return_storage_ptr__;
}

Assistant:

Literal truncateForPacking(Literal value, const Field& field) {
    if (field.type == Type::i32) {
      int32_t c = value.geti32();
      if (field.packedType == Field::i8) {
        value = Literal(c & 0xff);
      } else if (field.packedType == Field::i16) {
        value = Literal(c & 0xffff);
      }
    }
    return value;
  }